

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

Literals * wasm::getLiteralsFromConstExpression(Literals *__return_storage_ptr__,Expression *curr)

{
  initializer_list<wasm::Literal> init;
  bool bVar1;
  TupleMake *pTVar2;
  Expression **ppEVar3;
  Iterator IVar4;
  Literal *local_f8;
  element_type local_a8;
  Expression *local_68;
  Expression *operand;
  Iterator __end2;
  undefined1 local_40 [8];
  Iterator __begin2;
  ExpressionList *__range2;
  TupleMake *t;
  Expression *curr_local;
  Literals *values;
  
  pTVar2 = Expression::dynCast<wasm::TupleMake>(curr);
  if (pTVar2 == (TupleMake *)0x0) {
    getLiteralFromConstExpression((Literal *)&local_a8,curr);
    local_a8.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
    super_IString.str._M_str = (char *)&local_a8;
    local_a8.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 1;
    init._M_len = 1;
    init._M_array =
         (iterator)
         local_a8.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
         super_IString.str._M_str;
    Literals::Literals(__return_storage_ptr__,init);
    local_f8 = (Literal *)((long)&local_a8.values + 0x10);
    do {
      local_f8 = local_f8 + -1;
      Literal::~Literal(local_f8);
    } while ((element_type *)local_f8 != &local_a8);
  }
  else {
    Literals::Literals(__return_storage_ptr__);
    __begin2.index = (size_t)&pTVar2->operands;
    IVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                      ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                       __begin2.index);
    __begin2.parent = (ArenaVector<wasm::Expression_*> *)IVar4.index;
    local_40 = (undefined1  [8])IVar4.parent;
    IVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                      ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                       __begin2.index);
    while( true ) {
      __end2.parent = (ArenaVector<wasm::Expression_*> *)IVar4.index;
      operand = (Expression *)IVar4.parent;
      bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator!=((Iterator *)local_40,(Iterator *)&operand);
      if (!bVar1) break;
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)local_40);
      local_68 = *ppEVar3;
      getLiteralFromConstExpression((Literal *)((long)&local_a8.values + 0x20),local_68);
      SmallVector<wasm::Literal,_1UL>::push_back
                (&__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>,
                 (Literal *)((long)&local_a8.values + 0x20));
      Literal::~Literal((Literal *)((long)&local_a8.values + 0x20));
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)local_40);
      IVar4.index = (size_t)__end2.parent;
      IVar4.parent = (ArenaVector<wasm::Expression_*> *)operand;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Literals getLiteralsFromConstExpression(Expression* curr) {
  // TODO: Do we need this function given that Properties::getLiterals
  // (currently) does the same?
  if (auto* t = curr->dynCast<TupleMake>()) {
    Literals values;
    for (auto* operand : t->operands) {
      values.push_back(getLiteralFromConstExpression(operand));
    }
    return values;
  } else {
    return {getLiteralFromConstExpression(curr)};
  }
}